

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Marray<int,std::allocator<unsigned_long>> *this,InitializationSkipping *is,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,CoordinateOrder *coordinateOrder,allocator_type *allocator)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  int *data;
  runtime_error *this_00;
  size_type __n;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x38) = 1;
  this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  __n = 1;
  _Var1._M_current = begin._M_current;
  if (begin._M_current != end._M_current) {
    do {
      __n = __n * *_Var1._M_current;
      _Var1._M_current = _Var1._M_current + 1;
    } while (_Var1._M_current != end._M_current);
  }
  if (__n == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    data = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)(this + 0x40),__n,(void *)0x0);
    View<int,false,std::allocator<unsigned_long>>::
    assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<int,false,std::allocator<unsigned_long>> *)this,begin,end,data,coordinateOrder,
               coordinateOrder,allocator);
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    if (this[0x3c] != (Marray<int,std::allocator<unsigned_long>>)0x0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    const InitializationSkipping& is,
    ShapeIterator begin,
    ShapeIterator end,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
) 
: dataAllocator_(allocator)
{
    std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
        std::multiplies<std::size_t>());
    marray_detail::Assert(MARRAY_NO_ARG_TEST || size != 0);
    base::assign(begin, end, dataAllocator_.allocate(size), coordinateOrder, 
        coordinateOrder, allocator); 
    testInvariant();
}